

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

bool __thiscall
QListModel::moveRows
          (QListModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < sourceRow) {
    iVar3 = (**(code **)(*(long *)this + 0x78))();
    bVar1 = false;
    if ((destinationChild < 0) || (bVar1 = false, iVar3 < count + sourceRow)) goto LAB_00586235;
    iVar3 = (**(code **)(*(long *)this + 0x78))(this,destinationParent);
    bVar1 = false;
    if ((sourceRow == destinationChild) || (iVar3 < destinationChild)) goto LAB_00586235;
    if (((0 < count && destinationChild + -1 != sourceRow) &&
        (((sourceParent->r < 0 || (sourceParent->c < 0)) ||
         ((sourceParent->m).ptr == (QAbstractItemModel *)0x0)))) &&
       (((destinationParent->r < 0 || (destinationParent->c < 0)) ||
        ((destinationParent->m).ptr == (QAbstractItemModel *)0x0)))) {
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      local_68 = 0xffffffffffffffff;
      local_60 = 0;
      uStack_58 = 0;
      cVar2 = QAbstractItemModel::beginMoveRows
                        ((QModelIndex *)this,(int)&local_50,sourceRow,
                         (QModelIndex *)(ulong)((count + sourceRow) - 1),(int)&local_68);
      if (cVar2 != '\0') {
        if (count != 0) {
          iVar4 = destinationChild + -1;
          iVar3 = 0;
          if (destinationChild < sourceRow) {
            iVar4 = destinationChild;
            iVar3 = count + -1;
          }
          do {
            QList<QListWidgetItem_*>::move
                      (&this->items,(ulong)(uint)(iVar3 + sourceRow),(long)iVar4);
            count = count + -1;
          } while (count != 0);
        }
        QAbstractItemModel::endMoveRows();
        bVar1 = true;
        goto LAB_00586235;
      }
    }
  }
  bVar1 = false;
LAB_00586235:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QListModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count, const QModelIndex &destinationParent, int destinationChild)
{
    if (sourceRow < 0
        || sourceRow + count - 1 >= rowCount(sourceParent)
        || destinationChild < 0
        || destinationChild > rowCount(destinationParent)
        || sourceRow == destinationChild
        || sourceRow == destinationChild - 1
        || count <= 0
        || sourceParent.isValid()
        || destinationParent.isValid()) {
        return false;
    }
    if (!beginMoveRows(QModelIndex(), sourceRow, sourceRow + count - 1, QModelIndex(), destinationChild))
        return false;

    int fromRow = sourceRow;
    if (destinationChild < sourceRow)
        fromRow += count - 1;
    else
        destinationChild--;
    while (count--)
        items.move(fromRow, destinationChild);
    endMoveRows();
    return true;
}